

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_cond_init(uv_cond_t *cond)

{
  int iVar1;
  pthread_condattr_t attr;
  
  iVar1 = pthread_condattr_init((pthread_condattr_t *)&attr);
  if (iVar1 == 0) {
    iVar1 = pthread_condattr_setclock((pthread_condattr_t *)&attr,1);
    if ((iVar1 == 0) &&
       (iVar1 = pthread_cond_init((pthread_cond_t *)cond,(pthread_condattr_t *)&attr), iVar1 == 0))
    {
      iVar1 = pthread_condattr_destroy((pthread_condattr_t *)&attr);
      if (iVar1 == 0) {
        return 0;
      }
      pthread_cond_destroy((pthread_cond_t *)cond);
    }
    pthread_condattr_destroy((pthread_condattr_t *)&attr);
  }
  return -iVar1;
}

Assistant:

int uv_cond_init(uv_cond_t* cond) {
  pthread_condattr_t attr;
  int err;

  err = pthread_condattr_init(&attr);
  if (err)
    return UV__ERR(err);

  err = pthread_condattr_setclock(&attr, CLOCK_MONOTONIC);
  if (err)
    goto error2;

  err = pthread_cond_init(cond, &attr);
  if (err)
    goto error2;

  err = pthread_condattr_destroy(&attr);
  if (err)
    goto error;

  return 0;

error:
  pthread_cond_destroy(cond);
error2:
  pthread_condattr_destroy(&attr);
  return UV__ERR(err);
}